

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

int NGA_Create_config(int type,int ndim,int *dims,char *name,int *chunk,int p_handle)

{
  logical lVar1;
  long in_RDX;
  int in_ESI;
  long in_R8;
  int i_1;
  int i;
  Integer _ga_work [7];
  Integer _ga_dims [7];
  logical st;
  Integer g_a;
  Integer *ptr;
  int local_d0;
  int local_cc;
  Integer in_stack_ffffffffffffff38;
  Integer *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  Integer *in_stack_ffffffffffffff50;
  Integer in_stack_ffffffffffffff58;
  Integer in_stack_ffffffffffffff60;
  Integer *in_stack_ffffffffffffff70;
  long local_88 [9];
  int local_40;
  undefined1 *local_38;
  long local_28;
  long local_18;
  int local_c;
  int local_4;
  
  if (in_ESI < 8) {
    local_28 = in_R8;
    local_18 = in_RDX;
    local_c = in_ESI;
    for (local_cc = 0; local_cc < local_c; local_cc = local_cc + 1) {
      local_88[(local_c - local_cc) + -1] = (long)*(int *)(local_18 + (long)local_cc * 4);
    }
    if (local_28 == 0) {
      local_38 = (undefined1 *)0x0;
    }
    else {
      for (local_d0 = 0; local_d0 < local_c; local_d0 = local_d0 + 1) {
        *(long *)(&stack0xffffffffffffff38 + (long)((local_c - local_d0) + -1) * 8) =
             (long)*(int *)(local_28 + (long)local_d0 * 4);
      }
      local_38 = &stack0xffffffffffffff38;
    }
    lVar1 = pnga_create_config(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                               in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                               in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                               in_stack_ffffffffffffff70);
    if (lVar1 == 1) {
      local_4 = local_40;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int NGA_Create_config(int type, int ndim, int dims[], char *name, int chunk[],
                      int p_handle)
{
    Integer *ptr, g_a; 
    logical st;
    Integer _ga_dims[MAXDIM];
    Integer _ga_work[MAXDIM];
    if(ndim>MAXDIM)return 0;

    COPYC2F(dims,_ga_dims, ndim);
    if(!chunk)ptr=(Integer*)0;  
    else {
         COPYC2F(chunk,_ga_work, ndim);
         ptr = _ga_work;
    }
    st = wnga_create_config((Integer)type, (Integer)ndim, _ga_dims, name, ptr,
                    (Integer)p_handle, &g_a);
    if(st==TRUE) return (int) g_a;
    else return 0;
}